

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  u8 *puVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  u32 uVar6;
  uint *puVar7;
  PgHdr *pPVar8;
  u8 uVar9;
  u8 uVar10;
  BtShared *pBt;
  void *pvVar11;
  undefined8 uVar12;
  u8 **ppuVar13;
  u16 uVar14;
  ushort uVar15;
  ushort uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  undefined1 *puVar20;
  MemPage **ppMVar21;
  MemPage **extraout_RAX;
  int iVar22;
  void *pvVar23;
  long lVar24;
  uint uVar25;
  int iNew;
  MemPage **ppMVar26;
  BtShared *pBVar27;
  char cVar28;
  Pgno PVar29;
  MemPage *pMVar30;
  ulong uVar31;
  MemPage **ppMVar32;
  long lVar33;
  ulong uVar34;
  uint uVar35;
  MemPage *pMVar36;
  void *pvVar37;
  MemPage *pMVar38;
  u8 *puVar39;
  MemPage **ppMVar40;
  MemPage *pMVar41;
  uint uVar42;
  uint N;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  MemPage **ppMVar46;
  bool bVar47;
  MemPage *apOld [3];
  Pgno pgnoNew;
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  u16 szCell;
  MemPage *pChild;
  Pgno aPgOrder [5];
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  int local_294;
  MemPage **local_290;
  MemPage **local_288;
  MemPage *local_280;
  ulong local_278;
  ulong local_270;
  char local_261;
  BtCursor *local_260;
  MemPage **local_258;
  MemPage **local_250;
  MemPage **local_248;
  BtShared *local_240;
  MemPage **local_238;
  ulong local_230;
  ulong local_228;
  uint local_220;
  Pgno local_21c;
  MemPage *local_218 [3];
  uint uStack_1fc;
  Pgno local_1f8;
  uint local_1f4 [7];
  void *local_1d8;
  undefined8 local_1d0;
  uint auStack_1c8 [6];
  undefined4 local_1b0;
  undefined1 local_1ac;
  MemPage *local_1a8;
  uint local_19c;
  MemPage **local_198;
  uint *local_190;
  void *local_188;
  void *local_180;
  undefined8 local_178;
  MemPage *local_170 [4];
  void *local_150;
  MemPage *local_148 [3];
  CellInfo local_130;
  MemPage *local_118;
  CellArray local_110;
  uint auStack_a8 [8];
  long alStack_88 [3];
  void *local_70;
  ulong local_68;
  u16 auStack_60 [5];
  u8 local_55 [4];
  u8 auStack_51 [9];
  Pgno aPStack_48 [6];
  
  local_68 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  cVar28 = pCur->iPage;
  pMVar41 = pCur->pPage;
  local_188 = (void *)0x0;
  local_260 = pCur;
LAB_0014ee56:
  if ((pMVar41->nFree < 0) && (iVar17 = btreeComputeFreeSpace(pMVar41), iVar17 != 0)) {
LAB_0015086b:
    iVar17 = 0;
  }
  else {
    if (cVar28 != '\0') {
      if ((pMVar41->nOverflow == '\0') && (pMVar41->nFree <= (int)local_68)) goto LAB_0015086b;
      pMVar38 = pCur->apPage[(long)cVar28 + -1];
      uVar15 = pCur->aiIdx[(long)cVar28 + -1];
      iVar17 = sqlite3PagerWrite(pMVar38->pDbPage);
      if ((iVar17 == 0) &&
         ((local_261 = cVar28, -1 < pMVar38->nFree ||
          (iVar17 = btreeComputeFreeSpace(pMVar38), iVar17 == 0)))) {
        local_280 = pMVar41;
        if (((pMVar41->intKeyLeaf != '\0') &&
            (((pMVar41->nOverflow == '\x01' && (pMVar41->aiOvfl[0] == pMVar41->nCell)) &&
             (pMVar38->pgno != 1)))) && (pMVar38->nCell == uVar15)) {
          if (pMVar41->aiOvfl[0] == 0) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
            pMVar41 = local_280;
            iVar17 = 0xb;
          }
          else {
            pBVar27 = pMVar41->pBt;
            iVar17 = allocateBtreePage(pBVar27,(MemPage **)&local_178,&local_1f8,0,'\0');
            pMVar41 = local_280;
            if (iVar17 == 0) {
              local_218[0] = (MemPage *)local_280->apOvfl[0];
              local_148[0]._0_2_ = (*local_280->xCellSize)(local_280,(u8 *)local_218[0]);
              pMVar30 = (MemPage *)CONCAT44(local_178._4_4_,(int)local_178);
              zeroPage(pMVar30,0xd);
              local_110.nCell = 1;
              local_110.pRef = pMVar41;
              local_110.apCell = (u8 **)local_218;
              local_110.szCell = (u16 *)local_148;
              local_110.apEnd[0] = pMVar41->aDataEnd;
              local_110.ixNx[0] = 2;
              iVar17 = rebuildPage(&local_110,0,1,pMVar30);
              local_130.nKey._0_4_ = iVar17;
              if (iVar17 == 0) {
                pMVar30->nFree =
                     (pBVar27->usableSize - ((uint)(ushort)local_148[0] + (uint)pMVar30->cellOffset)
                     ) + -2;
                if ((pBVar27->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar27,local_1f8,'\x05',pMVar38->pgno,(int *)&local_130),
                   pMVar30->minLocal < (ushort)local_148[0])) {
                  ptrmapPutOvflPtr(pMVar30,pMVar30,&local_218[0]->isInit,(int *)&local_130);
                }
                uVar45 = (ulong)(CONCAT11(local_280->aCellIdx[(ulong)local_280->nCell * 2 + -2],
                                          local_280->aCellIdx[(ulong)local_280->nCell * 2 + -1]) &
                                local_280->maskPage);
                uVar34 = 0;
                puVar1 = local_280->aData + uVar45;
                pMVar41 = (MemPage *)(local_280->aData + uVar45 + 2);
                do {
                  pMVar36 = pMVar41;
                  puVar39 = puVar1;
                  if (7 < uVar34) break;
                  uVar34 = uVar34 + 1;
                  puVar1 = puVar39 + 1;
                  pMVar41 = (MemPage *)&pMVar36->bBusy;
                } while ((char)*puVar39 < '\0');
                lVar24 = 4;
                do {
                  local_218[0] = pMVar36;
                  uVar4 = *(u8 *)((long)&local_218[0][-1].xParseCell + 7);
                  local_55[lVar24] = uVar4;
                  lVar24 = lVar24 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar36 = (MemPage *)&local_218[0]->bBusy;
                } while (local_218[0] < (MemPage *)(puVar39 + 10));
                if ((int)local_130.nKey == 0) {
                  insertCell(pMVar38,(uint)pMVar38->nCell,local_55,(int)lVar24,(u8 *)0x0,
                             local_280->pgno,(int *)&local_130);
                }
                *(Pgno *)(pMVar38->aData + (ulong)pMVar38->hdrOffset + 8) =
                     local_1f8 >> 0x18 | (local_1f8 & 0xff0000) >> 8 | (local_1f8 & 0xff00) << 8 |
                     local_1f8 << 0x18;
                pMVar41 = local_280;
                iVar17 = (int)local_130.nKey;
                if (pMVar30 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar30->pDbPage);
                  pMVar41 = local_280;
                  iVar17 = (int)local_130.nKey;
                }
              }
              else {
                pMVar41 = local_280;
                if (pMVar30 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar30->pDbPage);
                  pMVar41 = local_280;
                }
              }
            }
          }
          goto LAB_0014fdd7;
        }
        local_180 = pcache1Alloc(pCur->pBt->pageSize);
        local_1b0 = 0;
        local_1ac = 0;
        local_110._0_8_ = local_110._0_8_ & 0xffffffff00000000;
        local_110.apCell = (u8 **)0x0;
        if (local_180 != (void *)0x0) {
          uVar35 = pCur->hints & 1;
          local_1d0 = (ulong)uVar35;
          uVar25 = (uint)pMVar38->nCell + (uint)pMVar38->nOverflow;
          local_228 = 0;
          if (1 < uVar25) {
            uVar42 = (uint)uVar15;
            if (uVar42 == 0) {
              local_228 = 0;
            }
            else if (uVar25 == uVar42) {
              local_228 = (ulong)((uVar15 + uVar35) - 2);
            }
            else {
              local_228 = (ulong)(uVar42 - 1);
            }
            uVar25 = 2 - uVar35;
          }
          local_238 = (MemPage **)(ulong)uVar25;
          uVar35 = ((int)local_228 - (uint)pMVar38->nOverflow) + uVar25;
          if (uVar35 == pMVar38->nCell) {
            uVar45 = (ulong)pMVar38->hdrOffset + 8;
          }
          else {
            uVar45 = (ulong)(CONCAT11(pMVar38->aCellIdx[(long)(int)uVar35 * 2],
                                      pMVar38->aCellIdx[(long)(int)uVar35 * 2 + 1]) &
                            pMVar38->maskPage);
          }
          local_190 = (uint *)(pMVar38->aData + uVar45);
          pBVar27 = pMVar38->pBt;
          uVar25 = uVar25 + 1;
          uVar35 = *local_190;
          PVar29 = uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 |
                   uVar35 << 0x18;
          local_198 = local_238;
          iVar17 = getAndInitPage(pBVar27,PVar29,local_218 + (long)local_238,(BtCursor *)0x0,0);
          local_290 = (MemPage **)(ulong)uVar25;
          local_220 = uVar25;
          if (iVar17 == 0) {
            local_278 = (ulong)(uint)((int)local_238 * 8);
            local_270 = (long)(int)local_228 - 1;
            ppMVar40 = local_238;
            local_294 = iVar17;
            local_240 = pBVar27;
            do {
              if ((local_218[(long)ppMVar40]->nFree < 0) &&
                 (iVar17 = btreeComputeFreeSpace(local_218[(long)ppMVar40]), local_294 = iVar17,
                 iVar17 != 0)) {
LAB_0014fca8:
                memset(local_218,0,local_278);
                pCur = local_260;
                goto LAB_0014fd4d;
              }
              ppMVar32 = (MemPage **)((long)ppMVar40 + -1);
              if (ppMVar40 == (MemPage **)0x0) {
                local_258 = (MemPage **)CONCAT44(local_258._4_4_,PVar29);
                uVar25 = ((pBVar27->pageSize - 8) / 6 + 4) * local_220 + 3 & 0xfffffffc;
                local_21c = PVar29;
                local_110.apCell =
                     (u8 **)sqlite3Malloc((long)(int)(pBVar27->pageSize + uVar25 * 10));
                pMVar41 = local_280;
                if ((MemPage **)local_110.apCell != (MemPage **)0x0) {
                  local_1a8 = pMVar38;
                  lVar24 = (long)(int)uVar25;
                  local_250 = (MemPage **)local_110.apCell + lVar24;
                  local_110.szCell = (u16 *)local_250;
                  local_1d8 = (void *)((long)local_250 + lVar24 * 2);
                  local_110.pRef = local_218[0];
                  local_19c = (uint)local_218[0]->leaf;
                  local_230 = (ulong)local_218[0]->leaf << 2;
                  local_118 = local_218[0];
                  local_278 = (ulong)local_218[0]->intKeyLeaf;
                  local_150 = (void *)((long)local_110.apCell + lVar24 * 10);
                  ppMVar40 = (MemPage **)0x0;
                  uVar45 = 0;
                  iVar17 = 0;
                  local_248 = (MemPage **)local_110.apCell;
                  goto LAB_0014f548;
                }
                iVar17 = 7;
                uVar25 = 0;
                pCur = local_260;
                ppMVar40 = local_290;
                goto LAB_0014fd6c;
              }
              if (pMVar38->nOverflow == 0) {
                iVar17 = (int)ppMVar40 + (int)local_270;
LAB_0014f35e:
                puVar39 = pMVar38->aData;
                lVar24 = (long)(int)(iVar17 - (uint)pMVar38->nOverflow);
                uVar15 = CONCAT11(pMVar38->aCellIdx[lVar24 * 2],pMVar38->aCellIdx[lVar24 * 2 + 1]) &
                         pMVar38->maskPage;
                puVar1 = puVar39 + uVar15;
                alStack_88[(long)ppMVar32] = (long)puVar1;
                local_258 = (MemPage **)CONCAT44(local_258._4_4_,*(undefined4 *)(puVar39 + uVar15));
                uVar14 = (*pMVar38->xCellSize)(pMVar38,puVar1);
                auStack_1c8[(long)ppMVar40 + -1] = (uint)uVar14;
                pvVar23 = local_180;
                if ((pBVar27->btsFlags & 0xc) != 0) {
                  iVar18 = (int)puVar1 - *(int *)&pMVar38->aData;
                  if ((int)pBVar27->usableSize < (int)(iVar18 + (uint)uVar14)) {
                    iVar17 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
                    goto LAB_0014fca8;
                  }
                  memcpy((void *)((long)iVar18 + (long)local_180),puVar1,(ulong)(uint)uVar14);
                  alStack_88[(long)ppMVar32] = ((long)puVar1 - (long)pMVar38->aData) + (long)pvVar23
                  ;
                  pBVar27 = local_240;
                }
                PVar29 = (Pgno)local_258 >> 0x18 | ((Pgno)local_258 & 0xff0000) >> 8 |
                         ((Pgno)local_258 & 0xff00) << 8 | (Pgno)local_258 << 0x18;
                dropCell(pMVar38,iVar17 - (uint)pMVar38->nOverflow,(uint)uVar14,&local_294);
              }
              else {
                if ((int)ppMVar40 + (int)local_270 != (uint)pMVar38->aiOvfl[0]) {
                  iVar17 = (int)local_228 + (int)ppMVar32;
                  goto LAB_0014f35e;
                }
                puVar7 = (uint *)pMVar38->apOvfl[0];
                alStack_88[(long)ppMVar32] = (long)puVar7;
                uVar25 = *puVar7;
                PVar29 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                         uVar25 << 0x18;
                uVar14 = (*pMVar38->xCellSize)(pMVar38,(u8 *)puVar7);
                auStack_1c8[(long)ppMVar40 + -1] = (uint)uVar14;
                pMVar38->nOverflow = '\0';
              }
              uVar45 = local_278;
              iVar17 = getAndInitPage(pBVar27,PVar29,(MemPage **)((long)&local_220 + local_278),
                                      (BtCursor *)0x0,0);
              local_278 = uVar45 - 8;
              ppMVar40 = ppMVar32;
              local_294 = iVar17;
            } while (iVar17 == 0);
            uVar25 = (int)ppMVar32 + 1;
            pMVar41 = local_280;
          }
          pCur = local_260;
          ppMVar40 = local_290;
          local_294 = iVar17;
          memset(local_218,0,(long)(int)uVar25 << 3);
          ppMVar32 = (MemPage **)0x0;
          goto LAB_0014fd5a;
        }
        iVar17 = 7;
        goto LAB_0014fdb5;
      }
      goto LAB_0014fdd7;
    }
    if (pMVar41->nOverflow == '\0') goto LAB_0015086b;
    local_110._0_8_ = (MemPage *)0x0;
    local_218[0] = (MemPage *)((ulong)local_218[0] & 0xffffffff00000000);
    pBVar27 = pMVar41->pBt;
    iVar17 = sqlite3PagerWrite(pMVar41->pDbPage);
    if (iVar17 == 0) {
      local_178._0_4_ =
           allocateBtreePage(pBVar27,(MemPage **)&local_110,(Pgno *)local_218,pMVar41->pgno,'\0');
      uVar12 = local_110._0_8_;
      copyNodeContent(pMVar41,(MemPage *)local_110._0_8_,(int *)&local_178);
      if (pBVar27->autoVacuum != '\0') {
        ptrmapPut(pBVar27,(Pgno)local_218[0],'\x05',pMVar41->pgno,(int *)&local_178);
      }
      iVar17 = (int)local_178;
      if ((int)local_178 == 0) {
        memcpy((u16 *)(uVar12 + 0x1c),pMVar41->aiOvfl,(ulong)((uint)pMVar41->nOverflow * 2));
        memcpy((u8 **)(uVar12 + 0x28),pMVar41->apOvfl,(ulong)pMVar41->nOverflow << 3);
        *(u8 *)(uVar12 + 0xc) = pMVar41->nOverflow;
        zeroPage(pMVar41,**(u8 **)(uVar12 + 0x50) & 0xfffffff7);
        *(Pgno *)(pMVar41->aData + (ulong)pMVar41->hdrOffset + 8) =
             (Pgno)local_218[0] >> 0x18 | ((Pgno)local_218[0] & 0xff0000) >> 8 |
             ((Pgno)local_218[0] & 0xff00) << 8 | (Pgno)local_218[0] << 0x18;
        pCur->apPage[1] = (MemPage *)uVar12;
        pCur->iPage = '\x01';
        pCur->ix = 0;
        pCur->aiIdx[0] = 0;
        pCur->apPage[0] = pMVar41;
        iVar17 = 0;
        cVar28 = '\x01';
        pMVar41 = (MemPage *)uVar12;
        goto LAB_0014fdf9;
      }
      pCur->apPage[1] = (MemPage *)0x0;
      if ((MemPage *)uVar12 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(uVar12 + 0x70));
      }
    }
    else {
      pCur->apPage[1] = (MemPage *)0x0;
    }
  }
  goto LAB_00150899;
  while( true ) {
    uVar15 = pMVar38->maskPage;
    puVar39 = puVar1 + pMVar38->cellOffset;
    lVar24 = (long)iVar17;
    local_288 = ppMVar40;
    local_270 = uVar45;
    memset((void *)((long)local_250 + lVar24 * 2),0,
           (ulong)(((uint)pMVar38->nOverflow + (uint)pMVar38->nCell) * 2));
    pMVar41 = local_280;
    ppMVar40 = local_288;
    bVar3 = pMVar38->nOverflow;
    if ((ulong)bVar3 != 0) {
      uVar16 = pMVar38->aiOvfl[0];
      if (uVar16 != 0) {
        lVar43 = lVar24 << 0x20;
        lVar33 = 0;
        do {
          *(u8 **)((long)local_248 + lVar33 * 4 + lVar24 * 8) =
               puVar1 + (uVar15 & CONCAT11(puVar39[lVar33],puVar39[lVar33 + 1]));
          lVar43 = lVar43 + 0x100000000;
          lVar33 = lVar33 + 2;
        } while ((uint)uVar16 * 2 != (int)lVar33);
        lVar24 = lVar43 >> 0x20;
        puVar39 = puVar39 + lVar33;
      }
      uVar45 = 0;
      do {
        local_248[lVar24 + uVar45] = (MemPage *)pMVar38->apOvfl[uVar45];
        uVar45 = uVar45 + 1;
      } while (bVar3 != uVar45);
      iVar17 = (int)lVar24 + (int)uVar45;
      local_110.nCell = iVar17;
    }
    uVar16 = pMVar38->cellOffset;
    uVar5 = pMVar38->nCell;
    if (puVar39 < puVar1 + (ulong)uVar5 * 2 + (ulong)uVar16) {
      lVar24 = (long)iVar17;
      lVar33 = 0;
      do {
        puVar2 = puVar39 + lVar33;
        *(u8 **)((long)local_248 + lVar33 * 4 + lVar24 * 8) =
             puVar1 + (CONCAT11(*puVar2,puVar2[1]) & uVar15);
        iVar17 = iVar17 + 1;
        local_110.nCell = iVar17;
        lVar33 = lVar33 + 2;
      } while (puVar2 + 2 < puVar1 + (ulong)uVar5 * 2 + (ulong)uVar16);
    }
    *(int *)((long)local_148 + (long)local_288 * 4) = iVar17;
    uVar45 = local_270;
    if ((local_288 < local_238) && ((char)local_278 == '\0')) {
      uVar25 = auStack_1c8[(long)local_288] & 0xffff;
      lVar24 = (long)iVar17;
      *(short *)((long)local_250 + lVar24 * 2) = (short)auStack_1c8[(long)local_288];
      pvVar23 = (void *)((long)local_1d8 + (long)(int)local_270);
      local_270 = (ulong)((int)local_270 + uVar25);
      memcpy(pvVar23,(void *)alStack_88[(long)local_288],(ulong)uVar25);
      pMVar30 = (MemPage *)((long)pvVar23 + local_230);
      local_248[lVar24] = pMVar30;
      uVar15 = *(short *)((long)local_250 + lVar24 * 2) - (short)local_230;
      *(ushort *)((long)local_250 + lVar24 * 2) = uVar15;
      uVar45 = local_270;
      if (pMVar38->leaf == '\0') {
        puVar1 = pMVar38->aData;
        uVar4 = puVar1[9];
        uVar9 = puVar1[10];
        uVar10 = puVar1[0xb];
        pMVar30->isInit = puVar1[8];
        pMVar30->bBusy = uVar4;
        pMVar30->intKey = uVar9;
        pMVar30->intKeyLeaf = uVar10;
      }
      else if (uVar15 < 4) {
        puVar20 = (undefined1 *)((long)(int)local_270 + (long)local_150);
        do {
          *puVar20 = 0;
          uVar15 = *(short *)((long)local_250 + lVar24 * 2) + 1;
          *(ushort *)((long)local_250 + lVar24 * 2) = uVar15;
          puVar20 = puVar20 + 1;
          uVar45 = (ulong)((int)uVar45 + 1);
        } while (uVar15 < 4);
      }
      iVar17 = iVar17 + 1;
      local_110.nCell = iVar17;
    }
    ppMVar40 = (MemPage **)((long)ppMVar40 + 1);
    if (ppMVar40 == local_290) break;
LAB_0014f548:
    pMVar38 = local_218[(long)ppMVar40];
    puVar1 = pMVar38->aData;
    if (*puVar1 != *local_118->aData) {
      ppMVar32 = (MemPage **)0x0;
      iVar17 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
      pCur = local_260;
      ppMVar40 = local_290;
      goto LAB_0014fd5a;
    }
  }
  alStack_88[2] = local_230 & 0xffff;
  local_270 = CONCAT44(local_270._4_4_,local_240->usableSize + (uint)(ushort)local_230 + -0xc);
  ppMVar40 = (MemPage **)0x0;
  iVar17 = 0;
  do {
    pMVar41 = local_218[(long)ppMVar40];
    local_110.apEnd[iVar17] = pMVar41->aDataEnd;
    uVar25 = *(uint *)((long)local_148 + (long)ppMVar40 * 4);
    local_110.ixNx[iVar17] = uVar25;
    iVar18 = 0;
    if ((iVar17 != 0) &&
       (iVar18 = iVar17 + -1, uVar25 != local_110.ixNx[(long)iVar17 + 0xffffffffffffffff])) {
      iVar18 = iVar17;
    }
    iVar17 = iVar18;
    if ((int)local_278 == 0) {
      iVar17 = iVar18 + 1;
      local_110.apEnd[(long)iVar18 + 1] = local_1a8->aDataEnd;
      auStack_a8[(long)iVar18 + -5] = uVar25 + 1;
    }
    uVar35 = (int)local_270 - pMVar41->nFree;
    auStack_1c8[(long)ppMVar40] = uVar35;
    if (pMVar41->nOverflow != '\0') {
      uVar45 = 0;
      do {
        uVar14 = (*pMVar41->xCellSize)(pMVar41,pMVar41->apOvfl[uVar45]);
        uVar35 = uVar35 + uVar14 + 2;
        auStack_1c8[(long)ppMVar40] = uVar35;
        uVar45 = uVar45 + 1;
      } while (uVar45 < pMVar41->nOverflow);
    }
    (&uStack_1fc)[(long)ppMVar40 + 1] = uVar25;
    ppMVar40 = (MemPage **)((long)ppMVar40 + 1);
    iVar17 = iVar17 + 1;
  } while (ppMVar40 != local_290);
  local_1d8 = (void *)(long)local_110.nCell;
  local_250 = (MemPage **)-(long)local_110.nCell;
  uVar45 = (ulong)local_220;
  local_248 = (MemPage **)CONCAT44(local_248._4_4_,local_110.nCell);
  local_288 = (MemPage **)local_110.szCell;
  pCur = local_260;
  ppMVar40 = (MemPage **)local_110.szCell;
  uVar34 = 0;
  uVar25 = local_110.nCell;
  do {
    uVar35 = auStack_1c8[uVar34];
    if ((int)local_270 < (int)uVar35) {
      local_230 = CONCAT44(local_230._4_4_,(int)uVar34 + 2);
      do {
        if ((long)(int)uVar45 <= (long)(uVar34 + 1)) {
          if (3 < uVar34) {
            auStack_1c8[uVar34] = uVar35;
            goto LAB_0014fd3f;
          }
          auStack_1c8[uVar34 + 1] = 0;
          (&uStack_1fc)[uVar34 + 2] = uVar25;
          uVar45 = local_230 & 0xffffffff;
        }
        uVar42 = (&uStack_1fc)[uVar34 + 1];
        lVar24 = (long)(int)uVar42;
        uVar44 = lVar24 - 1;
        uVar15 = *(ushort *)((long)ppMVar40 + lVar24 * 2 + -2);
        if (uVar15 == 0) {
          uVar15 = computeCellSize(&local_110,(uint)uVar44);
          ppMVar40 = local_288;
          uVar25 = (uint)local_248;
        }
        iVar17 = uVar15 + 2;
        if (((int)local_278 == 0) && (iVar17 = 0, (int)uVar42 < (int)uVar25)) {
          uVar16 = *(ushort *)((long)ppMVar40 + lVar24 * 2);
          if (uVar16 == 0) {
            uVar16 = computeCellSize(&local_110,uVar42);
            ppMVar40 = local_288;
            uVar25 = (uint)local_248;
          }
          iVar17 = uVar16 + 2;
        }
        auStack_1c8[uVar34 + 1] = auStack_1c8[uVar34 + 1] + iVar17;
        uVar35 = uVar35 - (uVar15 + 2);
        (&uStack_1fc)[uVar34 + 1] = (uint)uVar44;
        pCur = local_260;
      } while ((int)local_270 < (int)uVar35);
    }
    else {
      uVar44 = (ulong)(&uStack_1fc)[uVar34 + 1];
    }
    uVar31 = uVar34 + 1;
    auStack_1c8[uVar34] = uVar35;
    if ((int)uVar44 < (int)uVar25) {
      lVar24 = (long)(int)uVar44;
      local_230 = uVar45;
      do {
        lVar24 = lVar24 + 1;
        uVar15 = *(ushort *)((long)ppMVar40 + lVar24 * 2 + -2);
        iVar17 = (int)uVar44;
        if (uVar15 == 0) {
          uVar15 = computeCellSize(&local_110,iVar17);
          uVar45 = local_230;
          ppMVar40 = local_288;
          uVar25 = (uint)local_248;
        }
        uVar35 = uVar35 + uVar15 + 2;
        if ((int)local_270 < (int)uVar35) {
          if (uVar34 == 0) {
            uVar35 = 0;
          }
          else {
            uVar35 = (&uStack_1fc)[uVar34];
          }
          if (iVar17 <= (int)uVar35) goto LAB_0014fd3f;
          goto LAB_0014fa9f;
        }
        uVar42 = iVar17 + 1;
        uVar44 = (ulong)uVar42;
        auStack_1c8[uVar34] = uVar35;
        (&uStack_1fc)[uVar34 + 1] = uVar42;
        if ((int)local_278 == 0) {
          iVar17 = 0;
          if (lVar24 < (long)local_1d8) {
            uVar15 = *(ushort *)((long)ppMVar40 + lVar24 * 2);
            if (uVar15 == 0) {
              uVar15 = computeCellSize(&local_110,uVar42);
              uVar45 = local_230;
              ppMVar40 = local_288;
              uVar25 = (uint)local_248;
            }
            goto LAB_0014fa5f;
          }
        }
        else {
LAB_0014fa5f:
          iVar17 = uVar15 + 2;
        }
        auStack_1c8[uVar34 + 1] = auStack_1c8[uVar34 + 1] - iVar17;
      } while ((long)local_250 + lVar24 != 0);
    }
    uVar45 = uVar31 & 0xffffffff;
LAB_0014fa9f:
    uVar34 = uVar31;
  } while ((long)uVar31 < (long)(int)uVar45);
  local_70 = (void *)(ulong)((int)uVar45 - 1);
  pvVar37 = (void *)((long)ppMVar40 - (ulong)(uint)((int)local_278 * 2));
  local_1d8 = pvVar37;
  pvVar23 = local_70;
  local_230 = uVar45;
  do {
    pBVar27 = local_240;
    pMVar41 = local_280;
    if ((int)pvVar23 < 1) {
      local_250 = (MemPage **)CONCAT44(local_250._4_4_,(uint)*local_118->aData);
      if (0 < (int)local_230) {
        local_258 = (MemPage **)(local_230 & 0xffffffff);
        ppMVar46 = (MemPage **)0x0;
        ppMVar32 = (MemPage **)0x0;
        goto LAB_0014ffd6;
      }
      ppMVar32 = (MemPage **)0x0;
      local_1d0 = local_1d0 & 0xffffffff00000000;
      local_21c = (Pgno)local_258;
      goto LAB_0015029e;
    }
    uVar25 = *(uint *)((long)&local_1d0 + (long)pvVar23 * 4 + 4);
    uVar35 = auStack_1c8[(long)pvVar23];
    uVar42 = (&uStack_1fc)[(long)pvVar23];
    lVar24 = (long)(int)uVar42 - local_278;
    if (*(short *)((long)ppMVar40 + lVar24 * 2) == 0) {
      computeCellSize(&local_110,(int)lVar24);
      ppMVar40 = local_288;
      pvVar37 = local_1d8;
    }
    local_150 = pvVar23;
    local_250 = (MemPage **)(ulong)((uint)(pvVar23 == local_70) * 2 - 2);
    lVar24 = (long)(int)uVar42 + 1;
    do {
      N = uVar42 - 1;
      if (*(short *)((long)ppMVar40 + lVar24 * 2 + -4) == 0) {
        computeCellSize(&local_110,N);
        ppMVar40 = local_288;
        pvVar37 = local_1d8;
      }
      pCur = local_260;
      pMVar41 = local_280;
      if (uVar35 == 0) {
        uVar15 = *(ushort *)((long)ppMVar40 + lVar24 * 2 + -4);
        uVar19 = *(ushort *)((long)pvVar37 + lVar24 * 2 + -2) + 2;
      }
      else {
        if ((char)local_1d0 != '\0') break;
        uVar19 = *(ushort *)((long)pvVar37 + lVar24 * 2 + -2) + uVar35 + 2;
        uVar15 = *(ushort *)((long)ppMVar40 + lVar24 * 2 + -4);
        if ((int)(((int)local_250 + uVar25) - (uint)uVar15) < (int)uVar19) break;
      }
      uVar35 = uVar19;
      uVar25 = (uVar25 - uVar15) - 2;
      (&uStack_1fc)[(long)pvVar23] = N;
      lVar24 = lVar24 + -1;
      uVar42 = N;
    } while (1 < lVar24);
    pvVar11 = local_150;
    auStack_1c8[(long)local_150] = uVar35;
    auStack_1c8[(long)pvVar23 + -1] = uVar25;
    uVar25 = 0;
    if (pvVar11 != (void *)0x1) {
      uVar25 = (&uStack_1fc)[(ulong)((int)pvVar11 - 2) + 1];
    }
    pvVar23 = (void *)((long)pvVar23 + -1);
  } while ((int)uVar25 < (int)uVar42);
  iVar17 = 0xb;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
  ppMVar32 = (MemPage **)0x0;
  ppMVar40 = local_290;
  goto LAB_0014fd5a;
LAB_0014fd3f:
  iVar17 = 0xb;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
LAB_0014fd4d:
  ppMVar32 = (MemPage **)0x0;
  pMVar41 = local_280;
  ppMVar40 = local_290;
  goto LAB_0014fd5a;
LAB_0014ffd6:
  do {
    if (local_238 < ppMVar46) {
      PVar29 = 1;
      if ((char)local_1d0 == '\0') {
        PVar29 = local_21c;
      }
      local_294 = allocateBtreePage(pBVar27,(MemPage **)&local_130,&local_21c,PVar29,'\0');
      ppMVar40 = local_290;
      iVar17 = local_294;
      if (local_294 != 0) goto LAB_0014fd5a;
      pMVar38 = (MemPage *)CONCAT44(local_130.nKey._4_4_,(int)local_130.nKey);
      zeroPage(pMVar38,(int)local_250);
      local_170[(long)ppMVar46 + -1] = pMVar38;
      ppMVar32 = (MemPage **)(ulong)((int)ppMVar32 + 1);
      *(uint *)((long)local_148 + (long)ppMVar46 * 4) = (uint)local_248;
      if (pBVar27->autoVacuum != '\0') {
        ptrmapPut(pBVar27,pMVar38->pgno,'\x05',local_1a8->pgno,&local_294);
        goto joined_r0x001500ad;
      }
    }
    else {
      pMVar38 = local_218[(long)ppMVar46];
      local_170[(long)ppMVar46 + -1] = pMVar38;
      local_218[(long)ppMVar46] = (MemPage *)0x0;
      local_294 = sqlite3PagerWrite(pMVar38->pDbPage);
      ppMVar32 = (MemPage **)(ulong)((int)ppMVar32 + 1);
joined_r0x001500ad:
      ppMVar40 = local_290;
      iVar17 = local_294;
      if (local_294 != 0) goto LAB_0014fd5a;
    }
    ppMVar40 = local_290;
    ppMVar46 = (MemPage **)((long)ppMVar46 + 1);
  } while (local_258 != ppMVar46);
  if ((int)ppMVar32 < 1) {
    local_1d0 = local_1d0 & 0xffffffff00000000;
    local_21c = local_21c;
  }
  else {
    ppMVar46 = (MemPage **)0x0;
    do {
      pMVar38 = local_170[(long)ppMVar46 + -1];
      PVar29 = pMVar38->pgno;
      aPStack_48[(long)ppMVar46] = PVar29;
      auStack_a8[(long)ppMVar46] = PVar29;
      auStack_60[(long)ppMVar46] = pMVar38->pDbPage->flags;
      if (ppMVar46 != (MemPage **)0x0) {
        ppMVar26 = (MemPage **)0x0;
        do {
          if (aPStack_48[(long)ppMVar26] == PVar29) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
            iVar17 = 0xb;
            goto LAB_0014fd5a;
          }
          ppMVar26 = (MemPage **)((long)ppMVar26 + 1);
        } while (ppMVar46 != ppMVar26);
      }
      ppMVar46 = (MemPage **)((long)ppMVar46 + 1);
    } while (ppMVar46 != ppMVar32);
    ppMVar40 = (MemPage **)0x0;
    do {
      ppMVar46 = (MemPage **)0x0;
      if ((int)ppMVar32 != 1) {
        ppMVar21 = (MemPage **)0x1;
        ppMVar26 = (MemPage **)0x0;
        do {
          ppMVar46 = (MemPage **)((ulong)ppMVar21 & 0xffffffff);
          if (auStack_a8[(int)ppMVar26] <= auStack_a8[(long)ppMVar21]) {
            ppMVar46 = ppMVar26;
          }
          ppMVar21 = (MemPage **)((long)ppMVar21 + 1);
          ppMVar26 = ppMVar46;
        } while (ppMVar32 != ppMVar21);
      }
      lVar24 = (long)(int)ppMVar46;
      local_258 = (MemPage **)CONCAT44(local_258._4_4_,auStack_a8[lVar24]);
      auStack_a8[lVar24] = 0xffffffff;
      if (ppMVar40 != ppMVar46) {
        if ((long)ppMVar40 < lVar24) {
          pPVar8 = local_170[lVar24 + -1]->pDbPage;
          uVar6 = local_240->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,(int)ppMVar46 + uVar6 + 1);
        }
        pMVar41 = local_170[(long)ppMVar40 + -1];
        pPVar8 = pMVar41->pDbPage;
        pPVar8->flags = auStack_60[lVar24];
        PVar29 = (Pgno)local_258;
        sqlite3PcacheMove(pPVar8,(Pgno)local_258);
        pMVar41->pgno = PVar29;
        ppMVar46 = extraout_RAX;
      }
      ppMVar40 = (MemPage **)((long)ppMVar40 + 1);
    } while (ppMVar40 != ppMVar32);
    local_1d0 = CONCAT44(local_1d0._4_4_,(int)CONCAT71((int7)((ulong)ppMVar46 >> 8),1));
    pBVar27 = local_240;
    local_21c = (Pgno)local_258;
  }
LAB_0015029e:
  uVar35 = (uint)ppMVar32;
  ppMVar40 = (MemPage **)(long)(int)uVar35;
  pvVar23 = (&local_180)[(long)ppMVar40];
  uVar25 = *(uint *)((long)pvVar23 + 4);
  *local_190 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 | uVar25 << 0x18;
  if ((((ulong)local_250 & 8) == 0) && (local_220 != uVar35)) {
    ppMVar46 = local_218;
    if ((int)local_220 < (int)uVar35) {
      ppMVar46 = (MemPage **)&local_178;
    }
    *(undefined4 *)(*(long *)((long)pvVar23 + 0x50) + 8) =
         *(undefined4 *)(ppMVar46[(long)local_238]->aData + 8);
  }
  iVar17 = (uint)local_248;
  local_288 = ppMVar32;
  local_250 = ppMVar40;
  if (0 < (int)(uint)local_248 && pBVar27->autoVacuum != '\0') {
    bVar47 = (int)local_278 == 0;
    pMVar30 = (MemPage *)CONCAT44(local_178._4_4_,(int)local_178);
    ppMVar26 = (MemPage **)(ulong)((uint)pMVar30->nCell + (uint)pMVar30->nOverflow);
    ppMVar46 = (MemPage **)0x0;
    iVar18 = 0;
    local_258 = (MemPage **)((ulong)local_258 & 0xffffffff00000000);
    pMVar38 = pMVar30;
    do {
      if (ppMVar46 == ppMVar26) {
        lVar24 = (long)iVar18;
        ppMVar40 = local_218 + lVar24 + 1;
        ppMVar32 = local_170 + lVar24;
        do {
          lVar24 = lVar24 + 1;
          ppMVar21 = ppMVar40;
          if (lVar24 < (long)local_250) {
            ppMVar21 = ppMVar32;
          }
          pMVar38 = *ppMVar21;
          ppMVar26 = (MemPage **)
                     (ulong)((int)ppMVar26 + (uint)bVar47 + (uint)pMVar38->nCell +
                            (uint)pMVar38->nOverflow);
          iVar18 = iVar18 + 1;
          ppMVar40 = ppMVar40 + 1;
          ppMVar32 = ppMVar32 + 1;
        } while (ppMVar46 == ppMVar26);
      }
      pMVar41 = (MemPage *)local_110.apCell[(long)ppMVar46];
      lVar24 = (long)(int)(Pgno)local_258;
      if (ppMVar46 == (MemPage **)(ulong)(&uStack_1fc)[lVar24 + 1]) {
        local_258 = (MemPage **)CONCAT44(local_258._4_4_,(Pgno)local_258 + 1);
        pMVar30 = local_170[lVar24];
        if ((int)local_278 != 0) goto LAB_001503d5;
      }
      else {
LAB_001503d5:
        if (((((int)local_288 <= iVar18) || (pMVar30->pgno != aPStack_48[iVar18])) ||
            (pMVar41 < (MemPage *)pMVar38->aData)) || ((MemPage *)pMVar38->aDataEnd <= pMVar41)) {
          if ((char)local_19c == '\0') {
            uVar25._0_1_ = pMVar41->isInit;
            uVar25._1_1_ = pMVar41->bBusy;
            uVar25._2_1_ = pMVar41->intKey;
            uVar25._3_1_ = pMVar41->intKeyLeaf;
            local_238 = ppMVar46;
            ptrmapPut(local_240,
                      uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                      uVar25 << 0x18,'\x05',pMVar30->pgno,&local_294);
            ppMVar46 = local_238;
          }
          uVar15 = *(ushort *)((long)local_110.szCell + (long)ppMVar46 * 2);
          if (uVar15 == 0) {
            local_238 = ppMVar46;
            uVar15 = computeCellSize(&local_110,(int)ppMVar46);
            ppMVar46 = local_238;
          }
          if (pMVar30->minLocal < uVar15) {
            ptrmapPutOvflPtr(pMVar30,pMVar38,(u8 *)pMVar41,&local_294);
          }
          pCur = local_260;
          ppMVar32 = local_288;
          pMVar41 = local_280;
          ppMVar40 = local_290;
          iVar17 = local_294;
          if (local_294 != 0) goto LAB_0014fd5a;
          iVar17 = local_110.nCell;
        }
      }
      ppMVar46 = (MemPage **)((long)ppMVar46 + 1);
    } while ((long)ppMVar46 < (long)iVar17);
  }
  ppuVar13 = local_110.apCell;
  local_248 = (MemPage **)CONCAT44(local_248._4_4_,iVar17);
  if (1 < (int)local_288) {
    local_258 = (MemPage **)local_110.szCell;
    local_238 = (MemPage **)(ulong)((int)local_288 - 1);
    uVar45 = local_228 & 0xffffffff;
    ppMVar46 = (MemPage **)0x0;
    iVar18 = 0;
    local_228 = uVar45;
    do {
      pMVar41 = local_170[(long)ppMVar46 + -1];
      lVar24 = (long)(int)(&uStack_1fc)[(long)ppMVar46 + 1];
      pMVar38 = (MemPage *)ppuVar13[lVar24];
      uVar15 = *(ushort *)((long)local_258 + lVar24 * 2);
      uVar25 = (uint)uVar15 + (int)alStack_88[2];
      pMVar30 = (MemPage *)((long)iVar18 + (long)local_180);
      if (pMVar41->leaf == '\0') {
        puVar1 = pMVar41->aData;
        uVar4 = pMVar38->bBusy;
        uVar9 = pMVar38->intKey;
        uVar10 = pMVar38->intKeyLeaf;
        puVar1[8] = pMVar38->isInit;
        puVar1[9] = uVar4;
        puVar1[10] = uVar9;
        puVar1[0xb] = uVar10;
      }
      else if ((int)local_278 == 0) {
        pMVar38 = (MemPage *)((long)&pMVar38[-1].xParseCell + 4);
        if (uVar15 == 4) {
          uVar14 = (*local_1a8->xCellSize)(local_1a8,(u8 *)pMVar38);
          uVar25 = (uint)uVar14;
          uVar45 = local_228;
        }
      }
      else {
        (*pMVar41->xParseCell)(pMVar41,(u8 *)ppuVar13[lVar24 + -1],&local_130);
        iVar17 = sqlite3PutVarint((uchar *)&pMVar30->pgno,
                                  CONCAT44(local_130.nKey._4_4_,(int)local_130.nKey));
        uVar25 = iVar17 + 4;
        pMVar38 = pMVar30;
        pMVar30 = (MemPage *)0x0;
      }
      insertCell(local_1a8,(int)uVar45 + (int)ppMVar46,&pMVar38->isInit,uVar25,&pMVar30->isInit,
                 pMVar41->pgno,&local_294);
      pCur = local_260;
      ppMVar32 = local_288;
      pMVar41 = local_280;
      ppMVar40 = local_290;
      iVar17 = local_294;
      if (local_294 != 0) goto LAB_0014fd5a;
      iVar18 = iVar18 + uVar25;
      ppMVar46 = (MemPage **)((long)ppMVar46 + 1);
    } while (local_238 != ppMVar46);
  }
  iVar17 = (int)local_288;
  uVar25 = 1 - iVar17;
  pBVar27 = local_240;
  if ((int)uVar25 < iVar17) {
    bVar47 = (int)local_278 == 0;
    local_278 = CONCAT44(local_278._4_4_,local_1f8);
    iVar18 = iVar17 * 2 + -1;
    ppMVar40 = local_198;
    do {
      uVar35 = (uint)ppMVar40;
      uVar42 = -uVar25;
      if (0 < (int)uVar25) {
        uVar42 = uVar25;
      }
      uVar45 = (ulong)uVar42;
      if (*(char *)((long)&local_1b0 + uVar45) == '\0') {
        if ((int)uVar25 < 0) {
          uVar35 = (uint)local_198;
          ppMVar40 = local_198;
          if ((int)(&uStack_1fc)[(int)uVar42] <=
              *(int *)((long)local_148 + ((long)(int)uVar42 + -1) * 4)) goto LAB_0015067f;
        }
        else {
          if (uVar25 == 0) {
            iNew = 0;
            iVar17 = 0;
            iVar22 = (int)local_278;
          }
          else {
LAB_0015067f:
            if (uVar35 < uVar42) {
              uVar34 = (ulong)(uVar42 - 1);
              iVar17 = (uint)local_248;
            }
            else {
              uVar34 = (ulong)(int)(uVar42 - 1);
              iVar17 = *(int *)((long)local_148 + uVar34 * 4) + (uint)bVar47;
            }
            iNew = (&uStack_1fc)[uVar34 + 1] + (uint)bVar47;
            iVar22 = (&uStack_1fc)[uVar45 + 1] - iNew;
          }
          pMVar38 = local_170[uVar45 - 1];
          iVar17 = editPage(pMVar38,iVar17,iNew,iVar22,&local_110);
          pCur = local_260;
          ppMVar32 = local_288;
          pMVar41 = local_280;
          ppMVar40 = local_290;
          if (iVar17 != 0) goto LAB_0014fd5a;
          *(undefined1 *)((long)&local_1b0 + uVar45) = 1;
          pMVar38->nFree = (int)local_270 - auStack_1c8[uVar45];
          ppMVar40 = local_198;
          pBVar27 = local_240;
        }
      }
      uVar25 = uVar25 + 1;
      iVar18 = iVar18 + -1;
    } while (iVar18 != 0);
  }
  pMVar38 = local_1a8;
  pBt = local_240;
  pCur = local_260;
  pMVar41 = local_280;
  local_294 = 0;
  if (((local_261 == '\x01') && (local_1a8->nCell == 0)) &&
     (pMVar30 = (MemPage *)CONCAT44(local_178._4_4_,(int)local_178),
     (int)(uint)local_1a8->hdrOffset <= pMVar30->nFree)) {
    local_294 = defragmentPage(pMVar30,-1);
    copyNodeContent(pMVar30,pMVar38,&local_294);
    pCur = local_260;
    pMVar41 = local_280;
    iVar17 = local_294;
    if (local_294 == 0) {
      iVar17 = freePage2(pMVar30->pBt,pMVar30,pMVar30->pgno);
    }
  }
  else {
    iVar17 = 0;
    if (((byte)local_1d0 & (char)local_19c == '\0' & pBVar27->autoVacuum != '\0') == 1) {
      uVar45 = (ulong)local_288 & 0xffffffff;
      uVar34 = 0;
      do {
        uVar25 = *(uint *)(local_170[uVar34 - 1]->aData + 8);
        ptrmapPut(pBt,uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                      uVar25 << 0x18,'\x05',local_170[uVar34 - 1]->pgno,&local_294);
        uVar34 = uVar34 + 1;
        iVar17 = local_294;
      } while (uVar45 != uVar34);
    }
  }
  ppMVar46 = local_250;
  ppMVar32 = local_288;
  iVar22 = (int)local_288;
  iVar18 = (int)local_198;
  ppMVar40 = local_290;
  if (iVar22 <= iVar18) {
    lVar24 = 0;
    do {
      if (iVar17 == 0) {
        pMVar38 = local_218[(long)ppMVar46 + lVar24];
        iVar17 = freePage2(pMVar38->pBt,pMVar38,pMVar38->pgno);
      }
      lVar24 = lVar24 + 1;
      ppMVar40 = local_290;
    } while ((iVar18 - iVar22) + 1 != (int)lVar24);
  }
LAB_0014fd5a:
  uVar25 = (uint)ppMVar32;
  if ((MemPage **)local_110.apCell != (MemPage **)0x0) {
    sqlite3_free(local_110.apCell);
  }
LAB_0014fd6c:
  ppMVar32 = (MemPage **)0x0;
  do {
    if (local_218[(long)ppMVar32] != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_218[(long)ppMVar32]->pDbPage);
    }
    ppMVar32 = (MemPage **)((long)ppMVar32 + 1);
  } while (ppMVar40 != ppMVar32);
  if (0 < (int)uVar25) {
    uVar45 = 0;
    do {
      if (local_170[uVar45 - 1] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_170[uVar45 - 1]->pDbPage);
      }
      uVar45 = uVar45 + 1;
    } while (uVar25 != uVar45);
  }
LAB_0014fdb5:
  if (local_188 != (void *)0x0) {
    pcache1Free(local_188);
  }
  local_188 = local_180;
LAB_0014fdd7:
  pMVar41->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pMVar41->pDbPage);
  cVar28 = pCur->iPage + -1;
  pCur->iPage = cVar28;
  pMVar41 = pCur->apPage[cVar28];
LAB_0014fdf9:
  pCur->pPage = pMVar41;
  if (iVar17 != 0) {
LAB_00150899:
    if (local_188 != (void *)0x0) {
      pcache1Free(local_188);
    }
    return iVar17;
  }
  goto LAB_0014ee56;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}